

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::GetTargetSets
          (cmGlobalGenerator *this,TargetDependSet *projectTargets,TargetDependSet *originalTargets,
          cmLocalGenerator *root,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *generators)

{
  bool bVar1;
  reference ppcVar2;
  GeneratorTargetVector *this_00;
  pointer pcVar3;
  cmLocalGenerator *pcVar4;
  cmTargetDepend local_90;
  reference local_70;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  cmLocalGenerator *generator;
  iterator __end1;
  iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *generators_local;
  cmLocalGenerator *root_local;
  TargetDependSet *originalTargets_local;
  TargetDependSet *projectTargets_local;
  cmGlobalGenerator *this_local;
  
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(generators);
  generator = (cmLocalGenerator *)
              std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(generators);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                *)&generator);
    if (!bVar1) {
      return;
    }
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    pcVar4 = *ppcVar2;
    bVar1 = IsExcluded(this,root,pcVar4);
    if (!bVar1) {
      this_00 = cmLocalGenerator::GetGeneratorTargets(pcVar4);
      __end2 = std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::begin(this_00);
      target = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
               std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                         *)&target), bVar1) {
        local_70 = __gnu_cxx::
                   __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                   ::operator*(&__end2);
        pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                           (local_70);
        bVar1 = IsRootOnlyTarget(this,pcVar3);
        if (bVar1) {
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->(local_70);
          pcVar4 = cmGeneratorTarget::GetLocalGenerator(pcVar3);
          if (pcVar4 == root) goto LAB_00396b05;
        }
        else {
LAB_00396b05:
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (local_70);
          cmTargetDepend::cmTargetDepend(&local_90,pcVar3);
          std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
          insert(&originalTargets->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 ,&local_90);
          cmTargetDepend::~cmTargetDepend(&local_90);
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (local_70);
          AddTargetDepends(this,pcVar3,projectTargets);
        }
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGlobalGenerator::GetTargetSets(
  TargetDependSet& projectTargets, TargetDependSet& originalTargets,
  cmLocalGenerator* root, std::vector<cmLocalGenerator*>& generators)
{
  // loop over all local generators
  for (auto* generator : generators) {
    // check to make sure generator is not excluded
    if (this->IsExcluded(root, generator)) {
      continue;
    }
    // loop over all the generator targets in the makefile
    for (const auto& target : generator->GetGeneratorTargets()) {
      if (this->IsRootOnlyTarget(target.get()) &&
          target->GetLocalGenerator() != root) {
        continue;
      }
      // put the target in the set of original targets
      originalTargets.insert(target.get());
      // Get the set of targets that depend on target
      this->AddTargetDepends(target.get(), projectTargets);
    }
  }
}